

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_second_step1.cpp
# Opt level: O3

bool __thiscall
ruckig::PositionSecondOrderStep1::time_all_single_step
          (PositionSecondOrderStep1 *this,Profile *profile,double vMax,double vMin,double aMax,
          double aMin)

{
  bool bVar1;
  
  if (ABS(this->vf - this->v0) <= 2.220446049250313e-16) {
    (profile->t)._M_elems[4] = 0.0;
    (profile->t)._M_elems[5] = 0.0;
    (profile->t)._M_elems[2] = 0.0;
    (profile->t)._M_elems[3] = 0.0;
    (profile->t)._M_elems[0] = 0.0;
    (profile->t)._M_elems[1] = 0.0;
    (profile->t)._M_elems[6] = 0.0;
    if (ABS(this->v0) <= 2.220446049250313e-16) {
      if (2.220446049250313e-16 <= ABS(this->pd)) {
        return false;
      }
    }
    else {
      (profile->t)._M_elems[3] = this->pd / this->v0;
    }
    bVar1 = Profile::
            check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                      (profile,0.0,0.0,vMax,vMin);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool PositionSecondOrderStep1::time_all_single_step(Profile* profile, double vMax, double vMin, double aMax, double aMin) const {
    if (std::abs(vf - v0) > DBL_EPSILON) {
        return false;
    }

    profile->t[0] = 0;
    profile->t[1] = 0;
    profile->t[2] = 0;
    profile->t[3] = 0;
    profile->t[4] = 0;
    profile->t[5] = 0;
    profile->t[6] = 0;

    if (std::abs(v0) > DBL_EPSILON) {
        profile->t[3] = pd / v0;
        if (profile->check_for_second_order<ControlSigns::UDDU, ReachedLimits::NONE>(0.0, 0.0, vMax, vMin)) {
            return true;
        }

    } else if (std::abs(pd) < DBL_EPSILON) {
        if (profile->check_for_second_order<ControlSigns::UDDU, ReachedLimits::NONE>(0.0, 0.0, vMax, vMin)) {
            return true;
        }
    }

    return false;
}